

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  bool forwarding;
  SPIRType *pSVar1;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  forwarding = should_forward(this,op0);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_70,this,pSVar1,0);
  to_enclosed_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[2]>
            (&local_50,(spirv_cross *)local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
             (char (*) [2])&stack0xffffffffffffff68,(char **)&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
             (char (*) [2])op);
  emit_op(this,result_type,result_id,&local_50,forwarding,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(type_to_glsl(type), "(", op, to_enclosed_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}